

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_connection_internals(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  Curl_handler *pCStack_28;
  CURLcode result;
  Curl_handler *p;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pCStack_28 = conn->handler;
  if (pCStack_28->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
    CVar1 = (*pCStack_28->setup_connection)(data,conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pCStack_28 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCStack_28->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_connection_internals(struct Curl_easy *data,
                                           struct connectdata *conn)
{
  const struct Curl_handler *p;
  CURLcode result;

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(data, conn);

    if(result)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->port = p->defport;

  return CURLE_OK;
}